

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void getSubVectorsTranspose
               (HighsIndexCollection *index_collection,HighsInt data_dim,double *data0,double *data1
               ,double *data2,HighsSparseMatrix *matrix,HighsInt *num_sub_vector,
               double *sub_vector_data0,double *sub_vector_data1,double *sub_vector_data2,
               HighsInt *sub_matrix_num_nz,HighsInt *sub_matrix_start,HighsInt *sub_matrix_index,
               double *sub_matrix_value)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  pointer in_RCX;
  long in_RDX;
  int in_ESI;
  HighsIndexCollection *in_RDI;
  pointer in_R8;
  pointer in_R9;
  int *in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  int *in_stack_00000028;
  undefined4 *in_stack_00000030;
  long in_stack_00000038;
  HighsInt row_iEl;
  HighsInt new_iVector_2;
  HighsInt iVector_9;
  HighsInt iEl_1;
  HighsInt vector_1;
  HighsInt iVector;
  HighsInt iVector_8;
  HighsInt iVector_7;
  HighsInt new_iVector_1;
  HighsInt iVector_6;
  HighsInt iEl;
  HighsInt vector;
  HighsInt num_vector;
  vector<int,_std::allocator<int>_> sub_matrix_length;
  bool extract_matrix;
  bool extract_value;
  bool extract_index;
  bool extract_start;
  HighsInt new_iVector;
  HighsInt iVector_5;
  HighsInt iVector_4;
  HighsInt iVector_3;
  HighsInt iVector_2;
  HighsInt iVector_1;
  HighsInt k;
  vector<int,_std::allocator<int>_> new_index;
  HighsInt current_set_entry;
  HighsInt in_to_vector;
  HighsInt in_from_vector;
  HighsInt out_to_vector;
  HighsInt out_from_vector;
  HighsInt to_k;
  HighsInt from_k;
  size_type in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int iVar7;
  undefined4 in_stack_fffffffffffffee4;
  value_type vVar8;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  value_type in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  HighsInt *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  HighsIndexCollection *index_collection_00;
  int local_dc;
  int local_d8;
  int local_d0;
  int local_cc;
  int local_c0;
  int local_bc;
  vector<int,_std::allocator<int>_> local_b0;
  byte local_98;
  byte local_97;
  byte local_96;
  byte local_95;
  int local_94;
  int local_90;
  undefined4 local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  HighsIndexCollection local_68;
  long local_18;
  int local_c;
  HighsIndexCollection *local_8;
  
  local_68.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = in_R9;
  local_68.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_R8;
  local_68.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  limits(in_RDI,(HighsInt *)&local_68.field_0x34,(HighsInt *)&local_68.is_mask_);
  local_68.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = -1;
  local_68.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  index_collection_00 = &local_68;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x505a18);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             (size_type)in_stack_fffffffffffffef8);
  *in_stack_00000008 = 0;
  *in_stack_00000028 = 0;
  if ((local_8->is_mask_ & 1U) == 0) {
    local_68.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = -1;
    local_68.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._4_4_ = 0;
    for (local_78 = local_68._52_4_; local_78 <= (int)local_68._48_4_; local_78 = local_78 + 1) {
      updateOutInIndex(index_collection_00,
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       (HighsInt *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                       in_stack_fffffffffffffef8,
                       (HighsInt *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       (HighsInt *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      if (local_78 == local_68._52_4_) {
        for (local_7c = 0;
            local_7c <
            local_68.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish._4_4_; local_7c = local_7c + 1) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&local_68,(long)local_7c);
          *pvVar3 = -1;
        }
      }
      for (local_80 = local_68.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_;
          local_80 <=
          (int)local_68.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish; local_80 = local_80 + 1) {
        in_stack_ffffffffffffff0c = *in_stack_00000008;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&local_68,(long)local_80);
        *pvVar3 = in_stack_ffffffffffffff0c;
        *in_stack_00000008 = *in_stack_00000008 + 1;
      }
      for (local_84 = local_68.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
          local_84 <=
          (int)local_68.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage; local_84 = local_84 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&local_68,(long)local_84);
        *pvVar3 = -1;
      }
      if (local_c + -1 <=
          (int)local_68.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) break;
    }
  }
  else {
    for (local_88 = 0; local_88 < local_c; local_88 = local_88 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_8->mask_,(long)local_88);
      if (*pvVar5 == 0) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&local_68,(long)local_88);
        *pvVar3 = -1;
      }
      else {
        iVar1 = *in_stack_00000008;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&local_68,(long)local_88);
        *pvVar3 = iVar1;
        *in_stack_00000008 = *in_stack_00000008 + 1;
      }
    }
  }
  if (*in_stack_00000008 == 0) {
    local_8c = 1;
  }
  else {
    for (local_90 = 0; local_90 < local_c; local_90 = local_90 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&local_68,(long)local_90);
      local_94 = *pvVar3;
      if (-1 < local_94) {
        if (in_stack_00000010 != 0) {
          *(undefined8 *)(in_stack_00000010 + (long)local_94 * 8) =
               *(undefined8 *)(local_18 + (long)local_90 * 8);
        }
        if (in_stack_00000018 != 0) {
          *(undefined8 *)(in_stack_00000018 + (long)local_94 * 8) =
               *(undefined8 *)
                (local_68.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + (long)local_90 * 2);
        }
        if (in_stack_00000020 != 0) {
          *(undefined8 *)(in_stack_00000020 + (long)local_94 * 8) =
               *(undefined8 *)
                (local_68.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + (long)local_90 * 2);
        }
      }
    }
    local_95 = in_stack_00000030 != (undefined4 *)0x0;
    local_96 = in_stack_00000038 != 0;
    local_97 = _row_iEl != 0;
    local_98 = (bool)local_96 || (bool)local_97;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x505e69);
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,(value_type_conflict2 *)0x505e8b);
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)
                       (local_68.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 4));
    iVar1 = (int)sVar4 + -1;
    for (local_bc = 0; local_bc < iVar1; local_bc = local_bc + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          (local_68.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + 4),(long)local_bc);
      local_c0 = *pvVar5;
      while (in_stack_fffffffffffffef4 = local_c0,
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (local_68.mask_.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 4),(long)(local_bc + 1))
            , in_stack_fffffffffffffef4 < *pvVar5) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            (local_68.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + 0x10),(long)local_c0);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&local_68,(long)*pvVar5);
        if (-1 < *pvVar3) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_b0,(long)*pvVar3);
          *pvVar3 = *pvVar3 + 1;
        }
        local_c0 = local_c0 + 1;
      }
    }
    if ((local_95 & 1) == 0) {
      for (local_cc = 0; local_cc < *in_stack_00000008; local_cc = local_cc + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_b0,(long)local_cc);
        *in_stack_00000028 = *pvVar3 + *in_stack_00000028;
      }
      local_8c = 1;
    }
    else {
      *in_stack_00000030 = 0;
      for (local_d0 = 0; local_d0 < *in_stack_00000008 + -1; local_d0 = local_d0 + 1) {
        iVar7 = in_stack_00000030[local_d0];
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_b0,(long)local_d0);
        in_stack_00000030[local_d0 + 1] = iVar7 + *pvVar3;
        in_stack_fffffffffffffef0 = in_stack_00000030[local_d0];
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_b0,(long)local_d0);
        *pvVar3 = in_stack_fffffffffffffef0;
      }
      iVar2 = *in_stack_00000008 + -1;
      iVar7 = in_stack_00000030[iVar2];
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_b0,(long)iVar2);
      *in_stack_00000028 = iVar7 + *pvVar3;
      if ((local_98 & 1) == 0) {
        local_8c = 1;
      }
      else {
        vVar8 = in_stack_00000030[iVar2];
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_b0,(long)iVar2);
        *pvVar3 = vVar8;
        for (local_d8 = 0; local_d8 < iVar1; local_d8 = local_d8 + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              (local_68.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + 4),(long)local_d8);
          local_dc = *pvVar5;
          while (iVar7 = local_dc,
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)
                                    (local_68.mask_.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start + 4),
                                    (long)(local_d8 + 1)), iVar7 < *pvVar5) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (local_68.mask_.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 0x10),(long)local_dc);
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)&local_68,(long)*pvVar5);
            iVar7 = *pvVar3;
            if (-1 < iVar7) {
              pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_b0,(long)iVar7);
              iVar2 = *pvVar3;
              if ((local_96 & 1) != 0) {
                *(int *)(in_stack_00000038 + (long)iVar2 * 4) = local_d8;
              }
              if ((local_97 & 1) != 0) {
                pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)
                                    (local_68.mask_.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start + 0x16),(long)local_dc
                                   );
                *(value_type *)(_row_iEl + (long)iVar2 * 8) = *pvVar6;
              }
              pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_b0,(long)iVar7);
              *pvVar3 = *pvVar3 + 1;
            }
            local_dc = local_dc + 1;
          }
        }
        local_8c = 0;
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  return;
}

Assistant:

void getSubVectorsTranspose(const HighsIndexCollection& index_collection,
                            const HighsInt data_dim, const double* data0,
                            const double* data1, const double* data2,
                            const HighsSparseMatrix& matrix,
                            HighsInt& num_sub_vector, double* sub_vector_data0,
                            double* sub_vector_data1, double* sub_vector_data2,
                            HighsInt& sub_matrix_num_nz,
                            HighsInt* sub_matrix_start,
                            HighsInt* sub_matrix_index,
                            double* sub_matrix_value) {
  // Ensure that if there's no data0 then it's not required in the
  // sub-vector
  if (data0 == nullptr) assert(sub_vector_data0 == nullptr);
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  // Surely this is checked elsewhere
  assert(0 <= from_k && to_k < data_dim);
  assert(from_k <= to_k);
  // "Out" means not in the set to be extracted
  // "In" means in the set to be extracted
  HighsInt out_from_vector;
  HighsInt out_to_vector;
  HighsInt in_from_vector;
  HighsInt in_to_vector = -1;
  HighsInt current_set_entry = 0;
  // Set up a mask so that entries to be got from the matrix can be
  // identified and have their correct index.
  vector<HighsInt> new_index;
  new_index.resize(data_dim);

  num_sub_vector = 0;
  sub_matrix_num_nz = 0;
  if (!index_collection.is_mask_) {
    out_to_vector = -1;
    current_set_entry = 0;
    for (HighsInt k = from_k; k <= to_k; k++) {
      updateOutInIndex(index_collection, in_from_vector, in_to_vector,
                       out_from_vector, out_to_vector, current_set_entry);
      if (k == from_k) {
        // Account for any initial vectors not being extracted
        for (HighsInt iVector = 0; iVector < in_from_vector; iVector++) {
          new_index[iVector] = -1;
        }
      }
      for (HighsInt iVector = in_from_vector; iVector <= in_to_vector;
           iVector++) {
        new_index[iVector] = num_sub_vector;
        num_sub_vector++;
      }
      for (HighsInt iVector = out_from_vector; iVector <= out_to_vector;
           iVector++) {
        new_index[iVector] = -1;
      }
      if (out_to_vector >= data_dim - 1) break;
    }
  } else {
    for (HighsInt iVector = 0; iVector < data_dim; iVector++) {
      if (index_collection.mask_[iVector]) {
        new_index[iVector] = num_sub_vector;
        num_sub_vector++;
      } else {
        new_index[iVector] = -1;
      }
    }
  }

  // Bail out if no vectors are to be extracted
  if (num_sub_vector == 0) return;

  for (HighsInt iVector = 0; iVector < data_dim; iVector++) {
    HighsInt new_iVector = new_index[iVector];
    if (new_iVector >= 0) {
      assert(new_iVector < num_sub_vector);
      if (sub_vector_data0 != NULL)
        sub_vector_data0[new_iVector] = data0[iVector];
      if (sub_vector_data1 != NULL)
        sub_vector_data1[new_iVector] = data1[iVector];
      if (sub_vector_data2 != NULL)
        sub_vector_data2[new_iVector] = data2[iVector];
    }
  }
  const bool extract_start = sub_matrix_start != NULL;
  const bool extract_index = sub_matrix_index != NULL;
  const bool extract_value = sub_matrix_value != NULL;
  const bool extract_matrix = extract_index || extract_value;
  // Allocate an array of lengths for the sub-matrix to be
  // extracted: necessary even if just the number of nonzeros is
  // required
  vector<HighsInt> sub_matrix_length;
  sub_matrix_length.assign(num_sub_vector, 0);
  // Identify the lengths of the vectors in the sub-matrix to be extracted
  HighsInt num_vector = matrix.start_.size() - 1;
  for (HighsInt vector = 0; vector < num_vector; vector++) {
    for (HighsInt iEl = matrix.start_[vector]; iEl < matrix.start_[vector + 1];
         iEl++) {
      HighsInt iVector = matrix.index_[iEl];
      HighsInt new_iVector = new_index[iVector];
      if (new_iVector >= 0) sub_matrix_length[new_iVector]++;
    }
  }
  if (!extract_start) {
    // bail out if no matrix starts are to be extracted, but only after
    // computing the number of nonzeros
    for (HighsInt iVector = 0; iVector < num_sub_vector; iVector++)
      sub_matrix_num_nz += sub_matrix_length[iVector];
    return;
  }
  // Allocate an array of lengths for the sub-matrix to be extracted
  sub_matrix_start[0] = 0;
  for (HighsInt iVector = 0; iVector < num_sub_vector - 1; iVector++) {
    sub_matrix_start[iVector + 1] =
        sub_matrix_start[iVector] + sub_matrix_length[iVector];
    sub_matrix_length[iVector] = sub_matrix_start[iVector];
  }
  HighsInt iVector = num_sub_vector - 1;
  sub_matrix_num_nz = sub_matrix_start[iVector] + sub_matrix_length[iVector];
  // Bail out if matrix indices and values are not required
  if (!extract_matrix) return;
  sub_matrix_length[iVector] = sub_matrix_start[iVector];
  // Fill the row-wise matrix with indices and values
  for (HighsInt vector = 0; vector < num_vector; vector++) {
    for (HighsInt iEl = matrix.start_[vector]; iEl < matrix.start_[vector + 1];
         iEl++) {
      HighsInt iVector = matrix.index_[iEl];
      HighsInt new_iVector = new_index[iVector];
      if (new_iVector >= 0) {
        HighsInt row_iEl = sub_matrix_length[new_iVector];
        if (extract_index) sub_matrix_index[row_iEl] = vector;
        if (extract_value) sub_matrix_value[row_iEl] = matrix.value_[iEl];
        sub_matrix_length[new_iVector]++;
      }
    }
  }
}